

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O1

void gen_block(_node_t *node)

{
  node_type_e nVar1;
  _node_t *node_00;
  ulong uVar2;
  
  syms_set_cur_scope(node->num_value);
  if (node->num_children != 0) {
    uVar2 = 0;
    do {
      node_00 = node->children[uVar2];
      nVar1 = node_00->type;
      if (nVar1 == ASSIGN) {
        gen_assign(node_00);
      }
      else if (nVar1 == FUNCTION) {
        fwrite("; FUNCTION\n",0xb,1,(FILE *)f);
        fprintf((FILE *)f,"%s:\n",node_00->identifier);
      }
      else if (nVar1 == STATEMENT_LIST) {
        gen_block(node_00);
      }
      else if (nVar1 - BINOP < 2 || (node_00->id & 0xfffffffeU) == 0x86) {
        gen_expr(node_00);
        fwrite("        call print_a   ; DEBUG\n",0x1f,1,(FILE *)f);
      }
      else if (node_00->id == 0x83) {
        gen_jump(node_00);
      }
      else {
        ccerr(F,"unhandled node");
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < node->num_children);
  }
  syms_dec_scope();
  return;
}

Assistant:

void gen_block(_node_t* node)
{
    unsigned int i;
    _node_t* child;

    syms_set_cur_scope(node->num_value);

    for (i = 0; i < node->num_children; i++)
    {
        child = node->children[i];
        if (child->type == STATEMENT_LIST)
        {
            gen_block(child);
        }
        else if (child->type == FUNCTION)
        {
            fprintf(f, "; FUNCTION\n");
            fprintf(f, "%s:\n", child->identifier);
        }
        else if (child->type == ASSIGN)
        {
            gen_assign(child);
        }
        else if (child->id == CONSTANT || child->id == IDENTIFIER ||
                 child->type == BINOP || child->type == UNOP)
        {
            gen_expr(child);
            fprintf(f, "        call print_a   ; DEBUG\n");
        }
        else if (child->id == RETURN)
        {
            gen_jump(child);
        }
        else
        {
            ccerr(F, "unhandled node");
        }
    }

    syms_dec_scope();
}